

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void run_bitset_container_lazy_union
               (run_container_t *src_1,bitset_container_t *src_2,bitset_container_t *dst)

{
  ushort uVar1;
  ushort uVar2;
  rle16_t *prVar3;
  uint64_t *puVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  uVar6 = src_1->n_runs;
  if (((uVar6 == 1) && (src_1->runs->value == 0)) && (src_1->runs->length == 0xffff)) {
    __assert_fail("!run_container_is_full(src_1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x34af,
                  "void run_bitset_container_lazy_union(const run_container_t *, const bitset_container_t *, bitset_container_t *)"
                 );
  }
  if (src_2 != dst) {
    dst->cardinality = src_2->cardinality;
    memcpy(dst->words,src_2->words,0x2000);
    uVar6 = src_1->n_runs;
  }
  if (0 < (int)uVar6) {
    prVar3 = src_1->runs;
    puVar4 = dst->words;
    uVar7 = 0;
    do {
      uVar1 = prVar3[uVar7].value;
      uVar2 = prVar3[uVar7].length;
      uVar8 = (uint)uVar2 + (uint)uVar1;
      uVar9 = (uint)(uVar1 >> 6);
      uVar10 = uVar8 >> 6;
      if (uVar10 - uVar9 == 0) {
        puVar4[uVar9] =
             puVar4[uVar9] |
             (0xffffffffffffffffU >> (0x3fU - (char)uVar2 & 0x3f)) << ((byte)uVar1 & 0x3f);
      }
      else {
        uVar5 = puVar4[uVar10];
        puVar4[uVar9] = puVar4[uVar9] | -1L << ((byte)uVar1 & 0x3f);
        if (uVar9 + 1 < uVar10) {
          memset(puVar4 + (ulong)(uVar1 >> 6) + 1,0xff,
                 (ulong)((uVar10 - uVar9) - 2 >> 1) * 0x10 + 0x10);
        }
        puVar4[uVar10] = uVar5 | 0xffffffffffffffffU >> (~(byte)uVar8 & 0x3f);
      }
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  dst->cardinality = -1;
  return;
}

Assistant:

void run_bitset_container_lazy_union(const run_container_t *src_1,
                                     const bitset_container_t *src_2,
                                     bitset_container_t *dst) {
    assert(!run_container_is_full(src_1));  // catch this case upstream
    if (src_2 != dst) bitset_container_copy(src_2, dst);
    for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
        rle16_t rle = src_1->runs[rlepos];
        bitset_set_lenrange(dst->words, rle.value, rle.length);
    }
    dst->cardinality = BITSET_UNKNOWN_CARDINALITY;
}